

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

Value * duckdb::MaxTempDirectorySizeSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  undefined1 *puVar1;
  string *psVar2;
  int iVar3;
  DBConfig *pDVar4;
  BufferManager *pBVar5;
  undefined4 extraout_var;
  StringUtil *pSVar6;
  idx_t in_RCX;
  _func_int **multiplier;
  optional_idx max_swap;
  optional_idx local_58;
  string local_50;
  string local_30;
  
  pDVar4 = DBConfig::GetConfig(context);
  pSVar6 = (StringUtil *)(pDVar4->options).maximum_swap_space;
  if (pSVar6 == (StringUtil *)0xffffffffffffffff) {
    pBVar5 = BufferManager::GetBufferManager(context);
    multiplier = pBVar5->_vptr_BufferManager;
    iVar3 = (*multiplier[0xd])(pBVar5);
    local_58.index = CONCAT44(extraout_var,iVar3);
    if (local_58.index == 0xffffffffffffffff) {
      Value::Value(__return_storage_ptr__,"90% of available disk space");
      return __return_storage_ptr__;
    }
    pSVar6 = (StringUtil *)optional_idx::GetIndex(&local_58);
    StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_50,pSVar6,0x400,(idx_t)multiplier);
    Value::Value(__return_storage_ptr__,&local_50);
    psVar2 = &local_50;
  }
  else {
    StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_30,pSVar6,0x400,in_RCX);
    Value::Value(__return_storage_ptr__,&local_30);
    psVar2 = &local_30;
  }
  puVar1 = *(undefined1 **)((psVar2->field_2)._M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1 != &psVar2->field_2) {
    operator_delete(puVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Value MaxTempDirectorySizeSetting::GetSetting(const ClientContext &context) {
	auto &config = DBConfig::GetConfig(context);
	if (config.options.maximum_swap_space != DConstants::INVALID_INDEX) {
		// Explicitly set by the user
		return Value(StringUtil::BytesToHumanReadableString(config.options.maximum_swap_space));
	}
	auto &buffer_manager = BufferManager::GetBufferManager(context);
	// Database is initialized, use the setting from the temporary directory
	auto max_swap = buffer_manager.GetMaxSwap();
	if (max_swap.IsValid()) {
		return Value(StringUtil::BytesToHumanReadableString(max_swap.GetIndex()));
	} else {
		// The temp directory has not been used yet
		return Value("90% of available disk space");
	}
}